

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O1

int ompt_get_state(ompt_wait_id_t *wait_id)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((ompt_enabled._0_1_ & 1) != 0) {
    iVar1 = __ompt_get_state_internal(wait_id);
    iVar2 = 0;
    if (iVar1 != 0x102) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_state(ompt_wait_id_t *wait_id) {
  if (!ompt_enabled.enabled)
    return ompt_state_work_serial;
  int thread_state = __ompt_get_state_internal(wait_id);

  if (thread_state == ompt_state_undefined) {
    thread_state = ompt_state_work_serial;
  }

  return thread_state;
}